

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O0

void __thiscall
banksia::UciEngine::parseLine(UciEngine *this,int cmdInt,string *cmdString,string *line)

{
  GameTimeController *pGVar1;
  Move MVar2;
  Move MVar3;
  Move MVar4;
  Move MVar5;
  Move MVar6;
  Move MVar7;
  Move MVar8;
  Move MVar9;
  bool bVar10;
  reference pvVar11;
  size_type sVar12;
  ulong uVar13;
  uint *__n;
  void *__buf;
  int in_ESI;
  Engine *in_RDI;
  char unaff_retaddr;
  string *in_stack_00000008;
  size_t i;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec_1;
  Move ponderMove;
  Move move;
  string ponderMoveString;
  value_type moveString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  double period;
  EngineComputingState oldComputingState;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  moveRecv;
  GameTimeController *timeCtrl;
  UciEngineCmd cmd;
  undefined4 in_stack_fffffffffffffe08;
  EngineComputingState in_stack_fffffffffffffe0c;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  *in_stack_fffffffffffffe18;
  reference in_stack_fffffffffffffe20;
  Move *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  ulong local_168;
  string local_160 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  Move local_128;
  Move local_118;
  Move local_108;
  Move local_f8;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  double local_90;
  EngineComputingState local_88;
  undefined4 local_84;
  string *in_stack_ffffffffffffff88;
  UciEngine *in_stack_ffffffffffffff90;
  string local_48 [72];
  
  if (-1 < in_ESI) {
    __n = &switchD_001b0a12::switchdataD_0020286c;
    switch(in_ESI) {
    case 0:
      Player::setState(&in_RDI->super_Player,ready);
      in_RDI[1].super_Player.name.field_2._M_local_buf[0] = '\0';
      (*(in_RDI->super_Player).super_Obj._vptr_Obj[0x24])();
      (*(in_RDI->super_Player).super_Obj._vptr_Obj[0x1f])();
      break;
    default:
      break;
    case 2:
      bVar10 = parseOption(stack0x00000108,(string *)move._0_8_);
      if (!bVar10) {
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                       in_stack_fffffffffffffe50);
        Engine::write(in_RDI,(int)local_48,__buf,(size_t)__n);
        std::__cxx11::string::~string(local_48);
      }
      break;
    case 3:
      if (in_RDI->computingState == thinking) {
        parseInfo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      break;
    case 4:
      pGVar1 = (in_RDI->super_Player).timeController;
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::function((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                  *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if ((pGVar1 == (GameTimeController *)0x0) ||
         (bVar10 = std::operator==((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                                    *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                                   (nullptr_t)
                                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
         bVar10)) {
        local_84 = 1;
      }
      else {
        in_RDI[1].super_Player.name.field_2._M_local_buf[0] = '\0';
        local_88 = in_RDI->computingState;
        in_RDI->computingState = idle;
        local_90 = GameTimeController::moveTimeConsumed
                             ((GameTimeController *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        splitString(in_stack_00000008,unaff_retaddr);
        sVar12 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&local_a8);
        MVar9.promotion = local_f8.promotion;
        MVar9.from = local_f8.from;
        MVar9.dest = local_f8.dest;
        MVar8.promotion = local_118.promotion;
        MVar8.from = local_118.from;
        MVar8.dest = local_118.dest;
        MVar5.promotion = local_108.promotion;
        MVar5.from = local_108.from;
        MVar5.dest = local_108.dest;
        MVar4.promotion = local_128.promotion;
        MVar4.from = local_128.from;
        MVar4.dest = local_128.dest;
        if (sVar12 < 2) {
          local_84 = 1;
          local_128 = MVar4;
          local_108 = MVar5;
          local_118 = MVar8;
          local_f8 = MVar9;
        }
        else {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          std::__cxx11::string::string(local_c8,(string *)pvVar11);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,"",&local_e9);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          sVar12 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_a8);
          if (3 < sVar12) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10
                                                ),
                                     (char *)CONCAT44(in_stack_fffffffffffffe0c,
                                                      in_stack_fffffffffffffe08));
            if (bVar10) {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
              std::__cxx11::string::operator=(local_e8,(string *)pvVar11);
            }
          }
          uVar13 = std::__cxx11::string::empty();
          MVar7.promotion = local_f8.promotion;
          MVar7.from = local_f8.from;
          MVar7.dest = local_f8.dest;
          MVar6.promotion = local_118.promotion;
          MVar6.from = local_118.from;
          MVar6.dest = local_118.dest;
          MVar3.promotion = local_108.promotion;
          MVar3.from = local_108.from;
          MVar3.dest = local_108.dest;
          MVar2.promotion = local_128.promotion;
          MVar2.from = local_128.from;
          MVar2.dest = local_128.dest;
          if ((uVar13 & 1) == 0) {
            bVar10 = std::operator!=((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                                      *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10
                                                ),
                                     (nullptr_t)
                                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            MVar7.promotion = local_f8.promotion;
            MVar7.from = local_f8.from;
            MVar7.dest = local_f8.dest;
            MVar6.promotion = local_118.promotion;
            MVar6.from = local_118.from;
            MVar6.dest = local_118.dest;
            MVar3.promotion = local_108.promotion;
            MVar3.from = local_108.from;
            MVar3.dest = local_108.dest;
            MVar2.promotion = local_128.promotion;
            MVar2.from = local_128.from;
            MVar2.dest = local_128.dest;
            if (bVar10) {
              local_108 = BoardCore::moveFromCoordiateString
                                    ((string *)
                                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
              local_f8 = local_108;
              local_128 = BoardCore::moveFromCoordiateString
                                    ((string *)
                                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
              local_118 = local_128;
              std::
              function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
              ::operator()((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                            *)CONCAT44(local_128.promotion,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                           (Move *)in_stack_fffffffffffffe18,
                           (double)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe0c);
              MVar2 = local_128;
              MVar3 = local_108;
              MVar6 = local_118;
              MVar7 = local_f8;
            }
          }
          local_84 = 2;
          local_128 = MVar2;
          local_108 = MVar3;
          local_118 = MVar6;
          local_f8 = MVar7;
          std::__cxx11::string::~string(local_e8);
          std::__cxx11::string::~string(local_c8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe20);
      }
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::~function((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                   *)0x1b0e82);
      break;
    case 5:
      splitString(in_stack_00000008,unaff_retaddr);
      sVar12 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_140);
      if (sVar12 < 3) {
        local_84 = 1;
      }
      else {
        std::__cxx11::string::string(local_160);
        local_168 = 2;
        while (uVar13 = local_168,
              sVar12 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&local_140), uVar13 < sVar12) {
          uVar13 = std::__cxx11::string::empty();
          if ((uVar13 & 1) == 0) {
            std::__cxx11::string::operator+=(local_160," ");
          }
          in_stack_fffffffffffffe20 =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                    CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          std::__cxx11::string::operator+=(local_160,(string *)in_stack_fffffffffffffe20);
          local_168 = local_168 + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                                 (char *)CONCAT44(in_stack_fffffffffffffe0c,
                                                  in_stack_fffffffffffffe08));
        if (bVar10) {
          std::__cxx11::string::operator=((string *)&(in_RDI->config).idName,local_160);
        }
        local_84 = 2;
        std::__cxx11::string::~string(local_160);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe20);
    }
  }
  return;
}

Assistant:

void UciEngine::parseLine(int cmdInt, const std::string& cmdString, const std::string& line)
{
    if (cmdInt < 0) return;
    
    auto cmd = static_cast<UciEngineCmd>(cmdInt);
    switch (cmd) {
        case UciEngineCmd::option:
            if (!parseOption(line)) {
                write("Unknown option " + line);
            }
            break;
            
        case UciEngineCmd::info:
            if (computingState == EngineComputingState::thinking) {
                parseInfo(line);
            }
            break;
            
        case UciEngineCmd::bestmove:
        {
            auto timeCtrl = timeController;
            auto moveRecv = moveReceiver;
            if (timeCtrl == nullptr || moveRecv == nullptr) {
                return;
            }
            
            assert(expectingBestmove);
            assert(computingState != EngineComputingState::idle);
            
            expectingBestmove = false;
            auto oldComputingState = computingState;
            computingState = EngineComputingState::idle;
            
            auto period = timeCtrl->moveTimeConsumed(); // moveTimeConsumed();
            
            auto vec = splitString(line, ' ');
            if (vec.size() < 2) {
                return;
            }
            auto moveString = vec.at(1);
            
            std::string ponderMoveString = "";
            if (vec.size() >= 4 && vec.at(2) == "ponder") {
                ponderMoveString = vec.at(3);
            }
            
            if (!moveString.empty() && moveReceiver != nullptr) {
                auto move = board->moveFromCoordiateString(moveString);
                auto ponderMove = board->moveFromCoordiateString(ponderMoveString);
                (moveRecv)(move, moveString, ponderMove, period, oldComputingState);
            }
            
            break;
        }

        case UciEngineCmd::uciok:
        {
            setState(PlayerState::ready);
            expectingBestmove = false;
            sendOptions();
            sendPing();
            break;
        }

        case UciEngineCmd::theId:
        {
            auto vec = splitString(line, ' ');
            if (vec.size() <= 2) {
                return;
            }
            
            std::string str;
            for(size_t i = 2; i < vec.size(); i++) {
                if (!str.empty()) str += " ";
                str += vec.at(i);
            }
            
            if (vec.at(1) == "name") { // name or author
                config.idName = str;
            }
            break;
        }
            
        default:
            break;
    }
}